

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::getBestBFromData
          (FastPForImpl<8U,_unsigned_int> *this,uint *in,uint8_t *bestb,uint8_t *bestcexcept,
          uint8_t *maxb)

{
  byte bVar1;
  uint32_t k;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int aiStack_128 [68];
  
  for (lVar3 = 0; lVar3 != 0x21; lVar3 = lVar3 + 1) {
    aiStack_128[lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar6 = in[lVar3];
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = iVar2 + 1;
    }
    aiStack_128[uVar6] = aiStack_128[uVar6] + 1;
  }
  bVar1 = 0x21;
  do {
    bVar1 = bVar1 - 1;
  } while (aiStack_128[bVar1] == 0);
  *bestb = bVar1;
  *maxb = bVar1;
  iVar2 = 0;
  bVar1 = *bestb;
  *bestcexcept = '\0';
  uVar7 = (uint)*bestb;
  uVar6 = (uint)bVar1 << 8;
  do {
    iVar11 = (*maxb - uVar7) + 8;
    iVar10 = (*maxb - uVar7) + 9;
    uVar8 = uVar7 << 8 | 8;
    do {
      uVar12 = (ulong)uVar7;
      uVar7 = uVar7 - 1;
      if (0x1f < uVar7) {
        return;
      }
      iVar2 = iVar2 + aiStack_128[uVar12];
      iVar4 = 0;
      if (iVar10 == 9) {
        iVar4 = iVar2;
      }
      iVar11 = iVar11 + 1;
      uVar9 = uVar8 - 0x100;
      iVar10 = iVar10 + 1;
      iVar4 = iVar11 * iVar2 - iVar4;
      uVar5 = iVar4 + -0x100 + uVar8;
      uVar8 = uVar9;
    } while (uVar6 <= uVar5);
    uVar6 = iVar4 + uVar9;
    *bestb = (uint8_t)uVar7;
    *bestcexcept = (uint8_t)iVar2;
  } while( true );
}

Assistant:

void getBestBFromData(const IntType *in, uint8_t &bestb, uint8_t &bestcexcept,
                        uint8_t &maxb) {
    uint8_t bits = sizeof(IntType) * 8;
    uint32_t freqs[65];
    for (uint32_t k = 0; k <= bits; ++k) freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = bits;
    while (freqs[bestb] == 0) bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < bits; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8;  // the  extra 8 is the cost of storing maxbits
      if (maxb - b == 1) thiscost -= cexcept;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }